

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall MemoryManager::addPage(MemoryManager *this,uint32_t addr)

{
  uint16_t uVar1;
  uint16_t uVar2;
  void *pvVar3;
  uint32_t in_ESI;
  long in_RDI;
  uint16_t k;
  uint16_t j;
  uint16_t i;
  undefined2 local_12;
  
  uVar1 = getFirstIndex(in_ESI);
  uVar2 = getSecondIndex(in_ESI);
  if (*(long *)(in_RDI + (ulong)uVar1 * 8) == 0) {
    pvVar3 = operator_new__(0x2000);
    *(void **)(in_RDI + (ulong)uVar1 * 8) = pvVar3;
    for (local_12 = 0; local_12 < 0x400; local_12 = local_12 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + (ulong)uVar1 * 8) + (ulong)local_12 * 8) = 0;
    }
  }
  if (*(long *)(*(long *)(in_RDI + (ulong)uVar1 * 8) + (ulong)uVar2 * 8) == 0) {
    pvVar3 = operator_new__(0x1000);
    *(void **)(*(long *)(in_RDI + (ulong)uVar1 * 8) + (ulong)uVar2 * 8) = pvVar3;
    memset(*(void **)(*(long *)(in_RDI + (ulong)uVar1 * 8) + (ulong)uVar2 * 8),0,0x1000);
  }
  return;
}

Assistant:

void MemoryManager::addPage(uint32_t addr){
    uint16_t i = this->getFirstIndex(addr);
    uint16_t j = this->getSecondIndex(addr);
    if(!this->memory[i]){
        this->memory[i] = new uint8_t* [1024];
        for(uint16_t k = 0; k < 1024; k++)
            this->memory[i][k] = nullptr;
    }
    if(!this->memory[i][j]){
        this->memory[i][j] = new uint8_t[4096];
        memset(this->memory[i][j], 0 , 4096);
//        for(uint16_t k = 0; k < 4096; k++)
//            this->memory[i][j][k] = 0;
    }
}